

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyboardImpl.cpp
# Opt level: O3

KeySym anon_unknown.dwarf_597764::scancodeToKeySym(Scancode code)

{
  Display *display;
  KeySym KVar1;
  
  display = sf::priv::OpenDisplay();
  ensureMapping();
  if ((code == Unknown) || ((&(anonymous_namespace)::scancodeToKeycode)[code] == '\0')) {
    KVar1 = 0;
  }
  else {
    KVar1 = XkbKeycodeToKeysym(display,(&(anonymous_namespace)::scancodeToKeycode)[code],0,0);
  }
  sf::priv::CloseDisplay(display);
  return KVar1;
}

Assistant:

KeySym scancodeToKeySym(sf::Keyboard::Scancode code)
{
    Display* display = sf::priv::OpenDisplay();

    KeySym keysym = NoSymbol;
    KeyCode keycode = scancodeToKeyCode(code);

    if (keycode != NullKeyCode) // ensure that this Scancode is mapped to keycode
        keysym = XkbKeycodeToKeysym(display, keycode, 0, 0);

    sf::priv::CloseDisplay(display);

    return keysym;
}